

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *
Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::zero(void)

{
  int iVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RDI;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  PStack_68;
  RationalConstantType local_58;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> local_38;
  
  if (Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p == '\0') {
    iVar1 = __cxa_guard_acquire(&Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p);
    if (iVar1 != 0) {
      RationalConstantType::RationalConstantType(&local_58,0);
      local_38._factors._cursor =
           (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
      local_38._factors._end = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
      local_38._factors._capacity = 0;
      local_38._factors._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
      Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)&PStack_68,&local_38);
      Monom(&zero::p,&local_58,&PStack_68);
      MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::~MonomFactors(&local_38);
      RationalConstantType::~RationalConstantType(&local_58);
      __cxa_atexit(~Monom,&zero::p,&__dso_handle);
      __cxa_guard_release(&Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p);
    }
  }
  IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)in_RDI,(IntegerConstantType *)&zero::p);
  IntegerConstantType::IntegerConstantType(&(in_RDI->numeral)._den,&zero::p.numeral._den);
  (in_RDI->factors)._id = zero::p.factors._id;
  (in_RDI->factors)._ptr = zero::p.factors._ptr;
  return in_RDI;
}

Assistant:

Monom<Number> Monom<Number>::zero() 
{ 
  static Monom p = Monom(Numeral(0), perfect(MonomFactors<Number>()));
  ASS(p.isZeroConst()) 
  return p; 
}